

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_list.hpp
# Opt level: O2

iterator __thiscall
gmlc::libguarded::
rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
::erase(rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
        *this,const_iterator iter)

{
  node *pnVar1;
  __pointer_type pnVar2;
  bool bVar3;
  zombie_list_node *in_RAX;
  zombie_list_node *__p2;
  __pointer_type pnVar4;
  __pointer_type pnVar5;
  zombie_list_node *oldZombie;
  
  oldZombie = in_RAX;
  std::mutex::lock(&this->m_write_mutex);
  pnVar1 = ((iter.m_current)->next)._M_b._M_p;
  if ((iter.m_current)->deleted == false) {
    (iter.m_current)->deleted = true;
    pnVar2 = ((iter.m_current)->back)._M_b._M_p;
    pnVar4 = ((iter.m_current)->next)._M_b._M_p;
    pnVar5 = pnVar2;
    if (pnVar2 == (__pointer_type)0x0) {
      pnVar5 = (__pointer_type)this;
    }
    LOCK();
    (pnVar5->next)._M_b._M_p = pnVar4;
    UNLOCK();
    if (pnVar4 == (__pointer_type)0x0) {
      pnVar4 = (__pointer_type)this;
    }
    LOCK();
    (pnVar4->back)._M_b._M_p = pnVar2;
    UNLOCK();
    __p2 = MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node>
           ::allocate(&this->m_zombie_alloc,1);
    (__p2->next)._M_b._M_p = (__pointer_type)0x0;
    (__p2->owner)._M_b._M_p = (__pointer_type)0x0;
    __p2->zombie_node = iter.m_current;
    oldZombie = (this->m_zombie_head)._M_b._M_p;
    do {
      LOCK();
      (__p2->next)._M_b._M_p = oldZombie;
      UNLOCK();
      bVar3 = std::
              atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node_*>
              ::compare_exchange_weak(&this->m_zombie_head,&oldZombie,__p2,memory_order_seq_cst);
    } while (!bVar3);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_write_mutex);
  return (iterator)pnVar1;
}

Assistant:

auto rcu_list<T, M, Alloc>::erase(const_iterator iter) -> iterator
{
    std::lock_guard<M> guard(m_write_mutex);
    // make sure the node has not already been marked for deletion
    node* oldNextOrig = iter.m_current->next.load();
    if (!iter.m_current->deleted) {
        iter.m_current->deleted = true;

        node* oldPrev = iter.m_current->back.load();
        node* oldNext = iter.m_current->next.load();

        if (oldPrev) {
            oldPrev->next.store(oldNext);
        } else {
            // no previous node, this node was the head
            m_head.store(oldNext);
        }

        if (oldNext) {
            oldNext->back.store(oldPrev);
        } else {
            // no next node, this node was the tail
            m_tail.store(oldPrev);
        }

        auto newZombie = zombie_alloc_trait::allocate(m_zombie_alloc, 1);
        zombie_alloc_trait::construct(m_zombie_alloc,
                                      newZombie,
                                      iter.m_current);

        zombie_list_node* oldZombie = m_zombie_head.load();

        do {
            newZombie->next = oldZombie;
        } while (!m_zombie_head.compare_exchange_weak(oldZombie, newZombie));
    }

    return iterator(oldNextOrig);
}